

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O1

TextFile * __thiscall asl::TextFile::operator>>(TextFile *this,String *x)

{
  int iVar1;
  size_t sVar2;
  char s [256];
  char acStack_118 [256];
  
  if ((this->super_File)._file == (FILE *)0x0) {
    iVar1 = File::open(&this->super_File,(char *)&(this->super_File)._path,8);
    if ((char)iVar1 == '\0') {
      return this;
    }
    if ((this->super_File)._file == (FILE *)0x0) {
      return this;
    }
  }
  __isoc99_fscanf((this->super_File)._file,"%255s",acStack_118);
  sVar2 = strlen(acStack_118);
  String::assign(x,acStack_118,(int)sVar2);
  return this;
}

Assistant:

TextFile& TextFile::operator>>(String &x)
{
	if(!_file && !open(READ))
		return *this;
	char s[256];
	int n = fscanf(_file, "%255s", s); if (n < 1) {}
	x = &s[0];
	return *this;
}